

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbstrmatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Clone
          (TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this)

{
  TPZStructMatrix *pTVar1;
  TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *in_RDI;
  TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
  *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0x130);
  TPZBandStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZBandStructMatrix(*this);
}